

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::RegexPattern::RegexPattern
          (RegexPattern *this,JavascriptLibrary *library,Program *program,bool isLiteral)

{
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_013e0090;
  (this->testCache).ptr = (RegExpTestCache *)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptLibrary>::WriteBarrierSet(&this->library,library);
  this->field_0x18 = this->field_0x18 & 0xfc | isLiteral;
  (this->rep).unified.program.ptr = (Program *)0x0;
  (this->rep).unified.matcher.ptr = (Matcher *)0x0;
  (this->rep).unified.trigramInfo.ptr = (TrigramInfo *)0x0;
  Memory::WriteBarrierPtr<UnifiedRegex::Program>::WriteBarrierSet
            (&(this->rep).unified.program,program);
  (this->rep).unified.matcher.ptr = (Matcher *)0x0;
  (this->rep).unified.trigramInfo.ptr = (TrigramInfo *)0x0;
  return;
}

Assistant:

RegexPattern::RegexPattern(Js::JavascriptLibrary *const library, Program* program, bool isLiteral)
        : library(library), isLiteral(isLiteral), isShallowClone(false), testCache(nullptr)
    {
        rep.unified.program = program;
        rep.unified.matcher = nullptr;
        rep.unified.trigramInfo = nullptr;
    }